

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::asBool(Value *this)

{
  runtime_error *this_00;
  double *in_RDI;
  bool local_1;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0:
    local_1 = false;
    break;
  case 1:
    local_1 = *in_RDI != 0.0;
    break;
  case 2:
    local_1 = *in_RDI != 0.0;
    break;
  case 3:
    local_1 = *in_RDI != 0.0;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Value is not convertible to bool.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    local_1 = (bool)(*(byte *)in_RDI & 1);
  }
  return local_1;
}

Assistant:

bool Value::asBool() const {
  switch (type_) {
  case booleanValue:
    return value_.bool_;
  case nullValue:
    return false;
  case intValue:
    return value_.int_ ? true : false;
  case uintValue:
    return value_.uint_ ? true : false;
  case realValue:
    return value_.real_ ? true : false;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to bool.");
}